

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void cfd::core::ConvertFromUniValue<long>(long *value,UniValue *json_value)

{
  bool bVar1;
  string *psVar2;
  reference pcVar3;
  string *initialStr;
  CfdException *pCVar4;
  allocator local_229;
  string local_228 [32];
  CfdSourceLocation local_208;
  undefined1 local_1ea;
  allocator local_1e9;
  string local_1e8 [32];
  CfdSourceLocation local_1c8;
  long local_1b0;
  int64_t minimum;
  int64_t maximum;
  int64_t num;
  char *local_140;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  undefined1 local_129;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_128;
  bool is_digits_only;
  iterator begin_pos;
  string local_118 [32];
  UniValue local_f8;
  string local_90 [8];
  string str;
  undefined1 local_70 [8];
  UniValue json_value_copy;
  UniValue *json_value_local;
  long *value_local;
  
  json_value_copy.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = json_value;
  UniValue::UniValue((UniValue *)local_70,json_value);
  bVar1 = UniValue::isStr((UniValue *)local_70);
  if (bVar1) {
    psVar2 = (string *)UniValue::get_str_abi_cxx11_();
    std::__cxx11::string::string(local_90,psVar2);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_90,"0n");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,"0",(allocator *)((long)&begin_pos._M_current + 7));
      UniValue::UniValue(&local_f8,VNUM,(string *)local_118);
      UniValue::operator=((UniValue *)local_70,&local_f8);
      UniValue::~UniValue(&local_f8);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)((long)&begin_pos._M_current + 7));
    }
    else {
      _Stack_128._M_current = (char *)std::__cxx11::string::begin();
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&stack0xfffffffffffffed8);
      if (*pcVar3 == '-') {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&stack0xfffffffffffffed8);
      }
      local_138._M_current = _Stack_128._M_current;
      local_140 = (char *)std::__cxx11::string::end();
      local_129 = std::all_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                            (local_138,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )local_140,isdigit);
      if ((bool)local_129) {
        initialStr = (string *)UniValue::get_str_abi_cxx11_();
        UniValue::UniValue((UniValue *)&num,VNUM,initialStr);
        UniValue::operator=((UniValue *)local_70,(UniValue *)&num);
        UniValue::~UniValue((UniValue *)&num);
      }
    }
    std::__cxx11::string::~string(local_90);
  }
  bVar1 = UniValue::isNum((UniValue *)local_70);
  if (bVar1) {
    maximum = UniValue::get_int64();
    minimum = std::numeric_limits<long>::max();
    local_1b0 = std::numeric_limits<long>::min();
    if ((maximum <= minimum) && (local_1b0 <= maximum)) {
      *value = maximum;
      UniValue::~UniValue((UniValue *)local_70);
      return;
    }
    local_1c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/../include/cfdcore/cfdcore_json_mapping_base.h"
                 ,0x2f);
    local_1c8.filename = local_1c8.filename + 1;
    local_1c8.line = 0xf8;
    local_1c8.funcname = "ConvertFromUniValue";
    logger::warn<long_const&>(&local_1c8,"Invalid json_value. : json_value={}",&maximum);
    local_1ea = 1;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1e8,"Json value convert error. Value out of range.",&local_1e9);
    CfdException::CfdException(pCVar4,kCfdOutOfRangeError,(string *)local_1e8);
    local_1ea = 0;
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_208.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/../include/cfdcore/cfdcore_json_mapping_base.h"
               ,0x2f);
  local_208.filename = local_208.filename + 1;
  local_208.line = 0x100;
  local_208.funcname = "ConvertFromUniValue";
  logger::warn<>(&local_208,"Invalid json format.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_228,"Json value convert error. Invalid json format.",&local_229);
  CfdException::CfdException(pCVar4,kCfdOutOfRangeError,(string *)local_228);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

inline void ConvertFromUniValue(
    T& value, const UniValue& json_value) {  // NOLINT
  using cfd::core::CfdError;
  using cfd::core::CfdException;
  using cfd::core::logger::warn;
  UniValue json_value_copy = json_value;
  if (json_value_copy.isStr()) {
    auto str = json_value.get_str();
    if (str == "0n") {
      json_value_copy = UniValue(UniValue::VNUM, "0");
    } else {
      auto begin_pos = str.begin();
      if (*begin_pos == '-') ++begin_pos;
      bool is_digits_only = std::all_of(begin_pos, str.end(), ::isdigit);
      // check max of int64 : execute call get_int64()
      if (is_digits_only) {
        json_value_copy = UniValue(UniValue::VNUM, json_value.get_str());
      }
    }
  }

  if (json_value_copy.isNum()) {
    const int64_t num = json_value_copy.get_int64();
    if (std::is_unsigned<T>::value) {
      uint64_t unsigned_num = static_cast<uint64_t>(num);
      uint64_t maximum = static_cast<uint64_t>(std::numeric_limits<T>::max());
      if ((num < 0) || (maximum < unsigned_num)) {
        warn(CFD_LOG_SOURCE, "Invalid json_value. : json_value={}", num);
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "Json value convert error. Value out of range.");
      }
    } else {
      int64_t maximum = static_cast<int64_t>(std::numeric_limits<T>::max());
      int64_t minimum = static_cast<int64_t>(std::numeric_limits<T>::min());
      if ((maximum < num) || (minimum > num)) {
        warn(CFD_LOG_SOURCE, "Invalid json_value. : json_value={}", num);
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "Json value convert error. Value out of range.");
      }
    }
    value = static_cast<T>(num);
  } else {
    warn(CFD_LOG_SOURCE, "Invalid json format.");
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "Json value convert error. Invalid json format.");
  }
}